

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall CoinSelection_ConvertToUtxo_Test::TestBody(CoinSelection_ConvertToUtxo_Test *this)

{
  uint8_t *__last;
  uint32_t *lhs;
  undefined8 uVar1;
  bool bVar2;
  undefined1 extraout_DL;
  char *pcVar3;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_5;
  allocator_type local_251;
  ConfidentialAssetId asset;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  uint32_t vout;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_13;
  uint64_t block_height;
  void *binary_data;
  Txid txid;
  BlockHash block_hash;
  Script locking_script;
  undefined8 local_138;
  undefined1 local_130;
  string output_descriptor;
  Utxo utxo;
  
  block_height = 1;
  std::__cxx11::string::string
            ((string *)&utxo,"1234567890123456789012345678901234567890123456789012345678901456",
             (allocator *)&locking_script);
  cfd::core::BlockHash::BlockHash(&block_hash,(string *)&utxo);
  std::__cxx11::string::~string((string *)&utxo);
  std::__cxx11::string::string
            ((string *)&utxo,"0034567890123456789012345678901234567890123456789012345678901456",
             (allocator *)&locking_script);
  cfd::core::Txid::Txid(&txid,(string *)&utxo);
  std::__cxx11::string::~string((string *)&utxo);
  vout = 2;
  std::__cxx11::string::string
            ((string *)&utxo,"0014c59664568fad58004e1fac1b275826d8b525e935",(allocator *)&asset);
  cfd::core::Script::Script(&locking_script,(string *)&utxo);
  std::__cxx11::string::~string((string *)&utxo);
  std::__cxx11::string::string
            ((string *)&output_descriptor,
             "wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1)"
             ,(allocator *)&utxo);
  local_138 = cfd::core::Amount::CreateBySatoshiAmount(20000);
  binary_data = &vout;
  local_130 = extraout_DL;
  memset(&utxo,0,0xd8);
  cfd::CoinSelection::ConvertToUtxo
            (block_height,&block_hash,&txid,vout,&locking_script,(string *)&output_descriptor,
             (Amount *)&local_138,&vout,&utxo,(Script *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::CoinSelection::ConvertToUtxo
                (block_height,&block_hash,&txid,vout,&locking_script,(string *)&output_descriptor,
                 (Amount *)&local_138,binary_data,&utxo,(Script *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&asset);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x295,
               "Expected: (CoinSelection::ConvertToUtxo( block_height, block_hash, txid, vout, locking_script, output_descriptor, amount, binary_data, &utxo)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&asset);
  }
  if ((ulong)utxo.script_length != 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_228,utxo.locking_script
               ,utxo.locking_script + utxo.script_length,(allocator_type *)&gtest_ar_2);
    cfd::core::ByteData::ByteData((ByteData *)&gtest_ar_16,(vector *)&local_228);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar3 = (char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                              (char)asset._vptr_ConfidentialAssetId);
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,
               "ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str()"
               ,"locking_script.GetHex().c_str()",pcVar3,(char *)gtest_ar_5._0_8_);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    std::__cxx11::string::~string((string *)&asset);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_16);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&asset);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x29a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&asset);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&asset);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&asset,"utxo.block_height","block_height",&utxo.block_height,&block_height)
  ;
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  __last = utxo.txid;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar,utxo.block_hash,__last
             ,(allocator_type *)&gtest_ar_13);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_228,(vector *)&gtest_ar);
  cfd::core::BlockHash::BlockHash((BlockHash *)&gtest_ar_5,(ByteData256 *)&local_228);
  cfd::core::BlockHash::GetHex_abi_cxx11_();
  pcVar3 = (char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                            (char)asset._vptr_ConfidentialAssetId);
  cfd::core::BlockHash::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str()"
             ,"block_hash.GetHex().c_str()",pcVar3,(char *)gtest_ar_16._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&asset);
  cfd::core::BlockHash::~BlockHash((BlockHash *)&gtest_ar_5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&asset);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&asset);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  lhs = &utxo.vout;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar,__last,(uchar *)lhs,
             (allocator_type *)&gtest_ar_13);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_228,(vector *)&gtest_ar);
  cfd::core::Txid::Txid((Txid *)&gtest_ar_5,(ByteData256 *)&local_228);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar3 = (char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                            (char)asset._vptr_ConfidentialAssetId);
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str()"
             ,"txid.GetHex().c_str()",pcVar3,(char *)gtest_ar_16._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&asset);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar_5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&asset);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&asset);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&asset,"utxo.vout","vout",lhs,&vout);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  cfd::core::Script::GetData();
  gtest_ar_16._0_8_ = cfd::core::ByteData::GetDataSize();
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_long>
            ((internal *)&gtest_ar_5,"utxo.script_length","locking_script.GetData().GetDataSize()",
             &utxo.script_length,(unsigned_long *)&gtest_ar_16);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&asset);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&asset);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  gtest_ar_5._0_2_ = 4;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&asset,"utxo.address_type",
             "static_cast<uint16_t>(AddressType::kP2wpkhAddress)",&utxo.address_type,
             (unsigned_short *)&gtest_ar_5);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  gtest_ar_5._0_2_ = 0x6d;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&asset,"utxo.witness_size_max","static_cast<uint16_t>(109)",
             &utxo.witness_size_max,(unsigned_short *)&gtest_ar_5);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  gtest_ar_5._0_8_ = gtest_ar_5._0_8_ & 0xffffffffffff0000;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&asset,"utxo.uscript_size_max","static_cast<uint16_t>(0)",
             &utxo.uscript_size_max,(unsigned_short *)&gtest_ar_5);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  gtest_ar_5._0_8_ = cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)&asset,"utxo.amount","amount.GetSatoshiValue()",&utxo.amount,
             (long *)&gtest_ar_5);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  testing::internal::CmpHelperEQ<void*,void*>
            ((internal *)&asset,"utxo.binary_data","binary_data",&utxo.binary_data,&binary_data);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  std::__cxx11::string::string
            ((string *)&gtest_ar_5,
             "9934567890123456789012345678901234567890123456789012345678901456",
             (allocator *)&gtest_ar_16);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&gtest_ar_5);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  memset(&utxo,0,0xd8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::CoinSelection::ConvertToUtxo
                (block_height,&block_hash,&txid,vout,&locking_script,(string *)&output_descriptor,
                 (Amount *)&local_138,&asset,binary_data,&utxo,(Script *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2ac,
               "Expected: (CoinSelection::ConvertToUtxo( block_height, block_hash, txid, vout, locking_script, output_descriptor, amount, asset, binary_data, &utxo)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  if ((ulong)utxo.script_length != 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar,utxo.locking_script,
               utxo.locking_script + utxo.script_length,(allocator_type *)&gtest_ar_13);
    cfd::core::ByteData::ByteData((ByteData *)&local_228,(vector *)&gtest_ar);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    uVar1 = gtest_ar_5._0_8_;
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_2,
               "ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str()"
               ,"locking_script.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_16._0_8_);
    std::__cxx11::string::~string((string *)&gtest_ar_16);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_5);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x2b1,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_5,"utxo.block_height","block_height",&utxo.block_height,
             &block_height);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar_2,utxo.block_hash,
             __last,&local_251);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&gtest_ar,(vector *)&gtest_ar_2);
  cfd::core::BlockHash::BlockHash((BlockHash *)&gtest_ar_16,(ByteData256 *)&gtest_ar);
  cfd::core::BlockHash::GetHex_abi_cxx11_();
  uVar1 = gtest_ar_5._0_8_;
  cfd::core::BlockHash::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_13,
             "BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str()"
             ,"block_hash.GetHex().c_str()",(char *)uVar1,
             (char *)local_228._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  cfd::core::BlockHash::~BlockHash((BlockHash *)&gtest_ar_16);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_13.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_13.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_13.message_);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar_2,__last,(uchar *)lhs,
             &local_251);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&gtest_ar,(vector *)&gtest_ar_2);
  cfd::core::Txid::Txid((Txid *)&gtest_ar_16,(ByteData256 *)&gtest_ar);
  cfd::core::Txid::GetHex_abi_cxx11_();
  uVar1 = gtest_ar_5._0_8_;
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_13,
             "Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str()"
             ,"txid.GetHex().c_str()",(char *)uVar1,
             (char *)local_228._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar_16);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_13.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_13.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_13.message_);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_5,"utxo.vout","vout",lhs,&vout);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::core::Script::GetData();
  local_228._M_impl.super__Vector_impl_data._M_start = (pointer)cfd::core::ByteData::GetDataSize();
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_long>
            ((internal *)&gtest_ar_16,"utxo.script_length","locking_script.GetData().GetDataSize()",
             &utxo.script_length,(unsigned_long *)&local_228);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_5);
  if (gtest_ar_16.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_16.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_16.message_);
  gtest_ar_16._0_2_ = 4;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&gtest_ar_5,"utxo.address_type",
             "static_cast<uint16_t>(AddressType::kP2wpkhAddress)",&utxo.address_type,
             (unsigned_short *)&gtest_ar_16);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  gtest_ar_16._0_2_ = 0x6d;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&gtest_ar_5,"utxo.witness_size_max","static_cast<uint16_t>(109)",
             &utxo.witness_size_max,(unsigned_short *)&gtest_ar_16);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  gtest_ar_16._0_8_ = gtest_ar_16._0_8_ & 0xffffffffffff0000;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&gtest_ar_5,"utxo.uscript_size_max","static_cast<uint16_t>(0)",
             &utxo.uscript_size_max,(unsigned_short *)&gtest_ar_16);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2ba,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  gtest_ar_16._0_8_ = cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)&gtest_ar_5,"utxo.amount","amount.GetSatoshiValue()",&utxo.amount,
             (long *)&gtest_ar_16);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,699,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  testing::internal::CmpHelperEQ<void*,void*>
            ((internal *)&gtest_ar_5,"utxo.binary_data","binary_data",&utxo.binary_data,&binary_data
            );
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,700,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar_2,utxo.asset,
             &utxo.field_0xaa,&local_251);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar,(vector *)&gtest_ar_2);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar_5,(ByteData *)&gtest_ar);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  uVar1 = gtest_ar_16._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_13,
             "ConfidentialAssetId(ByteData(std::vector<uint8_t>(std::begin(utxo.asset), std::end(utxo.asset)))).GetHex().c_str()"
             ,"asset.GetHex().c_str()",(char *)uVar1,
             (char *)local_228._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar_5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_13.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_13.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2bd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_13.message_);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  std::__cxx11::string::~string((string *)&output_descriptor);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::Txid::~Txid(&txid);
  cfd::core::BlockHash::~BlockHash(&block_hash);
  return;
}

Assistant:

TEST(CoinSelection, ConvertToUtxo)
{
  uint64_t block_height = 1;
  BlockHash block_hash("1234567890123456789012345678901234567890123456789012345678901456");
  Txid txid("0034567890123456789012345678901234567890123456789012345678901456");
  uint32_t vout = 2;
  Script locking_script("0014c59664568fad58004e1fac1b275826d8b525e935");
  std::string output_descriptor("wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1)");
  Amount amount = Amount::CreateBySatoshiAmount(20000);
  void* binary_data = &vout;
  Utxo utxo = {};
  // std::vector<uint8_t> script_bytes;

  try {
    CoinSelection::ConvertToUtxo(
      block_height, block_hash, txid, vout, locking_script,
      output_descriptor, amount, binary_data, &utxo);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  EXPECT_NO_THROW((CoinSelection::ConvertToUtxo(
    block_height, block_hash, txid, vout, locking_script,
    output_descriptor, amount, binary_data, &utxo)));

  if (utxo.script_length != 0) {
    // script_bytes.resize(utxo.script_length);
    // memcpy(script_bytes.data(), utxo.locking_script, utxo.script_length);
    EXPECT_STREQ(ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str(), locking_script.GetHex().c_str());
  }
  EXPECT_EQ(utxo.block_height, block_height);
  EXPECT_STREQ(BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str(), block_hash.GetHex().c_str());
  EXPECT_STREQ(Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str(), txid.GetHex().c_str());
  EXPECT_EQ(utxo.vout, vout);
  EXPECT_EQ(utxo.script_length, locking_script.GetData().GetDataSize());
  EXPECT_EQ(utxo.address_type, static_cast<uint16_t>(AddressType::kP2wpkhAddress));
  EXPECT_EQ(utxo.witness_size_max, static_cast<uint16_t>(109));
  EXPECT_EQ(utxo.uscript_size_max, static_cast<uint16_t>(0));
  EXPECT_EQ(utxo.amount, amount.GetSatoshiValue());
  EXPECT_EQ(utxo.binary_data, binary_data);

#ifndef CFD_DISABLE_ELEMENTS
  ConfidentialAssetId asset("9934567890123456789012345678901234567890123456789012345678901456");
  memset(&utxo, 0, sizeof(utxo));
  EXPECT_NO_THROW((CoinSelection::ConvertToUtxo(
    block_height, block_hash, txid, vout, locking_script,
    output_descriptor, amount, asset, binary_data, &utxo)));

  if (utxo.script_length != 0) {
    // script_bytes.resize(utxo.script_length);
    // memcpy(script_bytes.data(), utxo.locking_script, utxo.script_length);
    EXPECT_STREQ(ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str(), locking_script.GetHex().c_str());
  }
  EXPECT_EQ(utxo.block_height, block_height);
  EXPECT_STREQ(BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str(), block_hash.GetHex().c_str());
  EXPECT_STREQ(Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str(), txid.GetHex().c_str());
  EXPECT_EQ(utxo.vout, vout);
  EXPECT_EQ(utxo.script_length, locking_script.GetData().GetDataSize());
  EXPECT_EQ(utxo.address_type, static_cast<uint16_t>(AddressType::kP2wpkhAddress));
  EXPECT_EQ(utxo.witness_size_max, static_cast<uint16_t>(109));
  EXPECT_EQ(utxo.uscript_size_max, static_cast<uint16_t>(0));
  EXPECT_EQ(utxo.amount, amount.GetSatoshiValue());
  EXPECT_EQ(utxo.binary_data, binary_data);
  EXPECT_STREQ(ConfidentialAssetId(ByteData(std::vector<uint8_t>(std::begin(utxo.asset), std::end(utxo.asset)))).GetHex().c_str(), asset.GetHex().c_str());
#endif                // CFD_DISABLE_ELEMENTS
}